

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O0

void __thiscall pstore::index::details::linear_node::linear_node(linear_node *this,linear_node *rhs)

{
  size_t sVar1;
  const_iterator __first;
  const_iterator __last;
  address *local_20;
  linear_node *rhs_local;
  linear_node *this_local;
  
  *(undefined8 *)(this->signature_)._M_elems = 0x72656e4c78646e49;
  sVar1 = size(rhs);
  this->size_ = sVar1;
  local_20 = this->leaves_;
  do {
    address::address(local_20);
    local_20 = local_20 + 1;
  } while ((linear_node *)local_20 != this + 1);
  __first = begin(rhs);
  __last = end(rhs);
  std::copy<pstore::address_const*,pstore::address*>(__first,__last,this->leaves_);
  return;
}

Assistant:

linear_node::linear_node (linear_node const & rhs)
                    : size_{rhs.size ()} {

                std::copy (rhs.begin (), rhs.end (), &leaves_[0]);
            }